

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hh
# Opt level: O0

const_dbl_view __thiscall Matrix::get_values(Matrix *this,int row)

{
  const_reference pvVar1;
  int local_34;
  const_reference local_30;
  int local_24;
  Matrix *pMStack_20;
  int row_local;
  Matrix *this_local;
  
  local_24 = row;
  pMStack_20 = this;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&this->row_ptrs,(long)row);
  local_30 = std::vector<double,_std::allocator<double>_>::operator[](&this->values,(long)*pvVar1);
  local_34 = row_nnz(this,local_24);
  std::pair<const_double_*,_unsigned_long>::pair<const_double_*,_int,_true>
            ((pair<const_double_*,_unsigned_long> *)&this_local,&local_30,&local_34);
  return _this_local;
}

Assistant:

const_dbl_view get_values(int row) const {
        return {&values[row_ptrs[row]], row_nnz(row)};
    }